

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O2

void __thiscall VDasher::updateActiveSegment(VDasher *this)

{
  float fVar1;
  ulong uVar2;
  Dash *pDVar3;
  byte bVar4;
  
  bVar4 = this->mDiscard;
  uVar2 = this->mIndex;
  do {
    bVar4 = (bVar4 & 1) == 0;
    if ((bool)bVar4) {
      this->mDiscard = true;
      pDVar3 = (Dash *)&this->mDashArray[uVar2].gap;
    }
    else {
      this->mDiscard = false;
      uVar2 = (uVar2 + 1) % this->mArraySize;
      this->mIndex = uVar2;
      pDVar3 = this->mDashArray + uVar2;
    }
    fVar1 = pDVar3->length;
    this->mCurrentLength = fVar1;
  } while (ABS(fVar1) <= 1e-06);
  this->mStartNewSegment = true;
  return;
}

Assistant:

void VDasher::updateActiveSegment()
{
    mStartNewSegment = true;

    if (mDiscard) {
        mDiscard = false;
        mIndex = (mIndex + 1) % mArraySize;
        mCurrentLength = mDashArray[mIndex].length;
    } else {
        mDiscard = true;
        mCurrentLength = mDashArray[mIndex].gap;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}